

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::Utils::getBlockVariableReference_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,VARIABLE_FLAVOUR flavour,GLchar *variable_name
          ,GLchar *block_name)

{
  undefined4 in_register_00000014;
  size_t position;
  size_t local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20 = 0;
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  replaceAllTokens("BLOCK_NAME",variable_name,__return_storage_ptr__);
  replaceToken("VARIABLE_NAME",&local_20,(GLchar *)CONCAT44(in_register_00000014,flavour),
               __return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getBlockVariableReference(VARIABLE_FLAVOUR flavour, const glw::GLchar* variable_name,
											 const glw::GLchar* block_name)
{
	/* Templates */
	static const GLchar* ref_template		= "BLOCK_NAME.VARIABLE_NAME";
	static const GLchar* array_ref_template = "BLOCK_NAME[0].VARIABLE_NAME";
	static const GLchar* tcs_ref_template   = "BLOCK_NAME[gl_InvocationID].VARIABLE_NAME";

	/* Token */
	static const GLchar* token_block_name	= "BLOCK_NAME";
	static const GLchar* token_variable_name = "VARIABLE_NAME";

	/* Variables */
	std::string variable_definition;
	size_t		position = 0;

	/* Select variable reference template */
	switch (flavour)
	{
	case BASIC:
		variable_definition = ref_template;
		break;
	case ARRAY:
		variable_definition = array_ref_template;
		break;
	case INDEXED_BY_INVOCATION_ID:
		variable_definition = tcs_ref_template;
		break;
	default:
		variable_definition = ref_template;
		break;
	}

	/* Replace tokens */
	replaceAllTokens(token_block_name, block_name, variable_definition);
	replaceToken(token_variable_name, position, variable_name, variable_definition);

	/* Done */
	return variable_definition;
}